

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::NewArrayExpression::fromSyntax
          (Compilation *compilation,NewArrayExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SymbolKind SVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Type *pTVar4;
  Expression *pEVar5;
  NewArrayExpression *expr;
  SourceRange SVar6;
  Expression *initExpr;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffb8;
  Expression *local_40;
  SourceRange local_38;
  
  if (assignmentTarget == (Type *)0x0) {
    SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x7a0007,SVar6);
    assignmentTarget = compilation->errorType;
  }
  else {
    pTVar4 = assignmentTarget->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
      pTVar4 = assignmentTarget->canonical;
    }
    SVar1 = (pTVar4->super_Symbol).kind;
    if ((SVar1 != DynamicArrayType) && (SVar1 != ErrorType)) {
      SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,(DiagCode)0x7a0007,SVar6);
    }
  }
  pEVar5 = Expression::selfDetermined
                     (compilation,(syntax->sizeExpr).ptr,context,(bitmask<slang::ast::ASTFlags>)0x0)
  ;
  local_40 = (Expression *)0x0;
  if (syntax->initializer != (ParenthesizedExpressionSyntax *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = context;
    local_40 = Expression::bindRValue
                         ((Expression *)assignmentTarget,
                          (Type *)(syntax->initializer->expression).ptr,(ExpressionSyntax *)0x0,
                          (SourceRange)(auVar2 << 0x40),(ASTContext *)0x0,in_stack_ffffffffffffffb8)
    ;
  }
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::NewArrayExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,assignmentTarget,pEVar5,&local_40,&local_38);
  bVar3 = Expression::bad(pEVar5);
  if ((!bVar3) &&
     (((local_40 == (Expression *)0x0 || (bVar3 = Expression::bad(local_40), !bVar3)) &&
      (bVar3 = ASTContext::requireIntegral(context,pEVar5), bVar3)))) {
    return &expr->super_Expression;
  }
  pEVar5 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar5;
}

Assistant:

Expression& NewArrayExpression::fromSyntax(Compilation& compilation,
                                           const NewArrayExpressionSyntax& syntax,
                                           const ASTContext& context,
                                           const Type* assignmentTarget) {
    if (!assignmentTarget ||
        assignmentTarget->getCanonicalType().kind != SymbolKind::DynamicArrayType) {

        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::NewArrayTarget, syntax.sourceRange());

        if (!assignmentTarget)
            assignmentTarget = &compilation.getErrorType();
    }

    auto& sizeExpr = selfDetermined(compilation, *syntax.sizeExpr, context);
    const Expression* initExpr = nullptr;
    if (syntax.initializer)
        initExpr = &bindRValue(*assignmentTarget, *syntax.initializer->expression, {}, context);

    auto result = compilation.emplace<NewArrayExpression>(*assignmentTarget, sizeExpr, initExpr,
                                                          syntax.sourceRange());
    if (sizeExpr.bad() || (initExpr && initExpr->bad()))
        return badExpr(compilation, result);

    if (!context.requireIntegral(sizeExpr))
        return badExpr(compilation, result);

    return *result;
}